

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O2

CURLcode Curl_pop3_write(connectdata *conn,char *str,size_t nread)

{
  int *piVar1;
  char cVar2;
  Curl_easy *pCVar3;
  size_t sVar4;
  CURLcode CVar5;
  size_t sVar6;
  long lVar7;
  size_t sVar8;
  size_t sVar9;
  byte bVar10;
  
  pCVar3 = conn->data;
  bVar10 = 0;
  sVar9 = 0;
  sVar8 = 0;
  do {
    sVar4 = (conn->proto).pop3c.eob;
    if (sVar8 == nread) {
      CVar5 = CURLE_OK;
      if (sVar4 == 0) {
        if (nread - sVar9 != 0) {
          CVar5 = Curl_client_write(conn,1,str + sVar9,nread - sVar9);
          return CVar5;
        }
      }
      else {
        CVar5 = CURLE_OK;
        if (sVar4 == 5) {
          CVar5 = Curl_client_write(conn,1,"\r\n.\r\n",2);
          piVar1 = &(pCVar3->req).keepon;
          *(byte *)piVar1 = (byte)*piVar1 & 0xfe;
          (conn->proto).ftpc.dirs = (char **)0x0;
        }
      }
      return CVar5;
    }
    cVar2 = str[sVar8];
    if (cVar2 == '\n') {
      if ((sVar4 == 4) || (sVar4 == 1)) {
        sVar6 = sVar4 + 1;
        goto LAB_00132d9f;
      }
LAB_00132da8:
      sVar6 = 0;
LAB_00132daa:
      (conn->proto).pop3c.eob = sVar6;
      if (sVar4 != 0) {
LAB_00132db6:
        for (lVar7 = -sVar4; lVar7 != 0; lVar7 = lVar7 + 1) {
          sVar4 = (conn->proto).pop3c.strip;
          if (sVar4 == 0) {
            CVar5 = Curl_client_write(conn,1,"\r\n.\r\n",-((ulong)bVar10 + lVar7));
            if (CVar5 != CURLE_OK) {
              return CVar5;
            }
            bVar10 = 0;
            sVar9 = sVar8;
            break;
          }
          *(size_t *)&(conn->proto).imapc.sasl.state = sVar4 - 1;
        }
      }
    }
    else if (cVar2 == '.') {
      sVar6 = 3;
      if (sVar4 != 2) {
        if (sVar4 != 3) goto LAB_00132da8;
        (conn->proto).ftpc.dirs = (char **)0x0;
        bVar10 = 1;
        goto LAB_00132db6;
      }
LAB_00132d9f:
      (conn->proto).pop3c.eob = sVar6;
    }
    else {
      if (cVar2 != '\r') goto LAB_00132da8;
      sVar6 = 4;
      if (sVar4 == 3) goto LAB_00132d9f;
      sVar6 = 1;
      if (sVar4 != 0) goto LAB_00132daa;
      (conn->proto).pop3c.eob = 1;
      if ((sVar8 != 0) &&
         (CVar5 = Curl_client_write(conn,1,str + sVar9,sVar8 - sVar9), sVar9 = sVar8,
         CVar5 != CURLE_OK)) {
        return CVar5;
      }
    }
    sVar8 = sVar8 + 1;
  } while( true );
}

Assistant:

CURLcode Curl_pop3_write(struct connectdata *conn, char *str, size_t nread)
{
  /* This code could be made into a special function in the handler struct */
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct SingleRequest *k = &data->req;

  struct pop3_conn *pop3c = &conn->proto.pop3c;
  bool strip_dot = FALSE;
  size_t last = 0;
  size_t i;

  /* Search through the buffer looking for the end-of-body marker which is
     5 bytes (0d 0a 2e 0d 0a). Note that a line starting with a dot matches
     the eob so the server will have prefixed it with an extra dot which we
     need to strip out. Additionally the marker could of course be spread out
     over 5 different data chunks. */
  for(i = 0; i < nread; i++) {
    size_t prev = pop3c->eob;

    switch(str[i]) {
    case 0x0d:
      if(pop3c->eob == 0) {
        pop3c->eob++;

        if(i) {
          /* Write out the body part that didn't match */
          result = Curl_client_write(conn, CLIENTWRITE_BODY, &str[last],
                                     i - last);

          if(result)
            return result;

          last = i;
        }
      }
      else if(pop3c->eob == 3)
        pop3c->eob++;
      else
        /* If the character match wasn't at position 0 or 3 then restart the
           pattern matching */
        pop3c->eob = 1;
      break;

    case 0x0a:
      if(pop3c->eob == 1 || pop3c->eob == 4)
        pop3c->eob++;
      else
        /* If the character match wasn't at position 1 or 4 then start the
           search again */
        pop3c->eob = 0;
      break;

    case 0x2e:
      if(pop3c->eob == 2)
        pop3c->eob++;
      else if(pop3c->eob == 3) {
        /* We have an extra dot after the CRLF which we need to strip off */
        strip_dot = TRUE;
        pop3c->eob = 0;
      }
      else
        /* If the character match wasn't at position 2 then start the search
           again */
        pop3c->eob = 0;
      break;

    default:
      pop3c->eob = 0;
      break;
    }

    /* Did we have a partial match which has subsequently failed? */
    if(prev && prev >= pop3c->eob) {
      /* Strip can only be non-zero for the very first mismatch after CRLF
         and then both prev and strip are equal and nothing will be output
         below */
      while(prev && pop3c->strip) {
        prev--;
        pop3c->strip--;
      }

      if(prev) {
        /* If the partial match was the CRLF and dot then only write the CRLF
           as the server would have inserted the dot */
        result = Curl_client_write(conn, CLIENTWRITE_BODY, (char *)POP3_EOB,
                                   strip_dot ? prev - 1 : prev);

        if(result)
          return result;

        last = i;
        strip_dot = FALSE;
      }
    }
  }

  if(pop3c->eob == POP3_EOB_LEN) {
    /* We have a full match so the transfer is done, however we must transfer
    the CRLF at the start of the EOB as this is considered to be part of the
    message as per RFC-1939, sect. 3 */
    result = Curl_client_write(conn, CLIENTWRITE_BODY, (char *)POP3_EOB, 2);

    k->keepon &= ~KEEP_RECV;
    pop3c->eob = 0;

    return result;
  }

  if(pop3c->eob)
    /* While EOB is matching nothing should be output */
    return CURLE_OK;

  if(nread - last) {
    result = Curl_client_write(conn, CLIENTWRITE_BODY, &str[last],
                               nread - last);
  }

  return result;
}